

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

int ndiSerialProbe(char *device,bool checkDSR)

{
  int iVar1;
  int local_444;
  int local_440;
  int errorCode;
  int n;
  NDIFileHandle serial_port;
  char init_reply [16];
  char reply [1024];
  bool checkDSR_local;
  char *device_local;
  
  errorCode = ndiSerialOpen(device);
  if (errorCode == -1) {
    device_local._4_4_ = 0x101;
  }
  else if ((checkDSR) && (iVar1 = ndiSerialCheckDSR(errorCode), iVar1 == 0)) {
    ndiSerialClose(errorCode);
    device_local._4_4_ = 0x200;
  }
  else {
    iVar1 = ndiSerialComm(errorCode,0x2580,"8N1",0);
    if ((iVar1 < 0) || (iVar1 = ndiSerialTimeout(errorCode,100), iVar1 < 0)) {
      ndiSerialClose(errorCode);
      device_local._4_4_ = 0x102;
    }
    else {
      ndiSerialFlush(errorCode,3);
      iVar1 = ndiSerialWrite(errorCode,"INIT:E3A5\r",10);
      if ((((iVar1 < 10) || (iVar1 = ndiSerialSleep(errorCode,100), iVar1 < 0)) ||
          (iVar1 = ndiSerialRead(errorCode,(char *)&n,0x10,false,&local_444), iVar1 < 1)) ||
         (iVar1 = strncmp((char *)&n,"OKAYA896\r",9), iVar1 != 0)) {
        ndiSerialTimeout(errorCode,7000);
        ndiSerialFlush(errorCode,3);
        iVar1 = ndiSerialFlush(errorCode,3);
        if ((iVar1 < 0) || (iVar1 = ndiSerialBreak(errorCode), iVar1 != 0)) {
          ndiSerialClose(errorCode);
          return 0x102;
        }
        local_440 = ndiSerialRead(errorCode,(char *)&n,0x10,false,&local_444);
        if (local_440 < 0) {
          ndiSerialClose(errorCode);
          return local_444;
        }
        if (local_440 == 0) {
          ndiSerialClose(errorCode);
          return 0x103;
        }
        iVar1 = strncmp((char *)&n,"RESETBE6F\r",10);
        if (iVar1 != 0) {
          ndiSerialClose(errorCode);
          return 0x201;
        }
        ndiSerialSleep(errorCode,100);
        local_440 = ndiSerialWrite(errorCode,"INIT:E3A5\r",10);
        if (local_440 < 0) {
          ndiSerialClose(errorCode);
          return 0x104;
        }
        if (local_440 < 10) {
          ndiSerialClose(errorCode);
          return 0x103;
        }
        ndiSerialSleep(errorCode,100);
        local_440 = ndiSerialRead(errorCode,(char *)&n,0x10,false,&local_444);
        if (local_440 < 0) {
          ndiSerialClose(errorCode);
          return 0x105;
        }
        if (local_440 == 0) {
          ndiSerialClose(errorCode);
          return 0x103;
        }
        iVar1 = strncmp((char *)&n,"OKAYA896\r",9);
        if (iVar1 != 0) {
          ndiSerialClose(errorCode);
          return 0x107;
        }
      }
      ndiSerialSleep(errorCode,100);
      iVar1 = ndiSerialWrite(errorCode,"GETINFO:Features.Firmware.Version0492\r",0x26);
      if (iVar1 == 0x26) {
        local_440 = ndiSerialRead(errorCode,init_reply + 8,0x3ff,false,&local_444);
        if (local_440 == 0) {
          ndiSerialClose(errorCode);
          device_local._4_4_ = 0x103;
        }
        else if (local_440 < 0) {
          ndiSerialClose(errorCode);
          device_local._4_4_ = local_444;
        }
        else {
          iVar1 = strncmp(init_reply + 8,"ERROR",5);
          if (iVar1 == 0) {
            iVar1 = ndiSerialWrite(errorCode,"VER:065EE\r",10);
            if ((iVar1 < 10) ||
               (local_440 = ndiSerialRead(errorCode,init_reply + 8,0x3ff,false,&local_444),
               local_440 < 7)) {
              ndiSerialClose(errorCode);
              return 0x203;
            }
          }
          else {
            iVar1 = strncmp(init_reply + 8,"Features",8);
            if (iVar1 != 0) {
              ndiSerialClose(errorCode);
              return 0x201;
            }
          }
          ndiSerialClose(errorCode);
          device_local._4_4_ = 0;
        }
      }
      else {
        ndiSerialClose(errorCode);
        device_local._4_4_ = 0x202;
      }
    }
  }
  return device_local._4_4_;
}

Assistant:

ndicapiExport int ndiSerialProbe(const char* device, bool checkDSR)
{
  char reply[1024];
  char init_reply[16];
  NDIFileHandle serial_port;
  int n;

  serial_port = ndiSerialOpen(device);
  if (serial_port == NDI_INVALID_HANDLE)
  {
    return NDI_OPEN_ERROR;
  }

  // check DSR line to see whether any device is connected
  if (checkDSR && !ndiSerialCheckDSR(serial_port))
  {
    ndiSerialClose(serial_port);
    return NDI_DSR_FAILURE;
  }

  // set comm parameters to default, but decrease timeout to 0.1s
  if (ndiSerialComm(serial_port, 9600, "8N1", 0) < 0 || ndiSerialTimeout(serial_port, 100) < 0)
  {
    ndiSerialClose(serial_port);
    return NDI_BAD_COMM;
  }

  // flush the buffers (which are unlikely to contain anything)
  ndiSerialFlush(serial_port, NDI_IOFLUSH);

  // try to initialize ndicapi
  int errorCode;
  if (ndiSerialWrite(serial_port, "INIT:E3A5\r", 10) < 10 || ndiSerialSleep(serial_port, 100) < 0 ||
      ndiSerialRead(serial_port, init_reply, 16, false, &errorCode) <= 0 || strncmp(init_reply, "OKAYA896\r", 9) != 0)
  {
    // increase timeout to 7 seconds for reset
    ndiSerialTimeout(serial_port, 7000);

    // init failed: flush, reset, and try again
    ndiSerialFlush(serial_port, NDI_IOFLUSH);
    if (ndiSerialFlush(serial_port, NDI_IOFLUSH) < 0 ||
        ndiSerialBreak(serial_port))
    {
      ndiSerialClose(serial_port);
      return NDI_BAD_COMM;
    }

    n = ndiSerialRead(serial_port, init_reply, 16, false, &errorCode);
    if (n < 0)
    {
      ndiSerialClose(serial_port);
      return errorCode;
    }
    else if (n == 0)
    {
      ndiSerialClose(serial_port);
      return NDI_TIMEOUT;
    }

    // check reply from reset
    if (strncmp(init_reply, "RESETBE6F\r", 10) != 0)
    {
      ndiSerialClose(serial_port);
      return NDI_BAD_REPLY;
    }
    // try to initialize a second time
    ndiSerialSleep(serial_port, 100);
    n = ndiSerialWrite(serial_port, "INIT:E3A5\r", 10);
    if (n < 0)
    {
      ndiSerialClose(serial_port);
      return NDI_WRITE_ERROR;
    }
    else if (n < 10)
    {
      ndiSerialClose(serial_port);
      return NDI_TIMEOUT;
    }

    ndiSerialSleep(serial_port, 100);
    n = ndiSerialRead(serial_port, init_reply, 16, false, &errorCode);
    if (n < 0)
    {
      ndiSerialClose(serial_port);
      return NDI_READ_ERROR;
    }
    else if (n == 0)
    {
      ndiSerialClose(serial_port);
      return NDI_TIMEOUT;
    }

    if (strncmp(init_reply, "OKAYA896\r", 9) != 0)
    {
      ndiSerialClose(serial_port);
      return NDI_PROBE_FAIL;
    }
  }

  ndiSerialSleep(serial_port, 100);
  if (ndiSerialWrite(serial_port, "GETINFO:Features.Firmware.Version0492\r", strlen("GETINFO:Features.Firmware.Version0492\r")) != strlen("GETINFO:Features.Firmware.Version0492\r"))
  {
    ndiSerialClose(serial_port);
    return NDI_NO_FEATURES_FIRMWARE;
  }

  n = ndiSerialRead(serial_port, reply, 1023, false, &errorCode);
  if (n == 0)
  {
    ndiSerialClose(serial_port);
    return NDI_TIMEOUT;
  }
  else if (n < 0)
  {
    ndiSerialClose(serial_port);
    return errorCode;
  }
  else
  {
    if (strncmp(reply, "ERROR", 5) == 0)
    {
      if (ndiSerialWrite(serial_port, "VER:065EE\r", 10) < 10 ||
          (n = ndiSerialRead(serial_port, reply, 1023, false, &errorCode)) < 7)
      {
        ndiSerialClose(serial_port);
        return NDI_COMMAND_VER_FAILED;
      }
    }
    else if (strncmp(reply, "Features", strlen("Features")) != 0)
    {
      ndiSerialClose(serial_port);
      return NDI_BAD_REPLY;
    }
  }

  // restore things back to the way they were
  ndiSerialClose(serial_port);

  return NDI_OKAY;
}